

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode cf_he_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  curl_trc_feat *pcVar4;
  Curl_cfilter *pCVar5;
  uint uVar6;
  int iVar7;
  CURLcode CVar8;
  long in_RAX;
  uint uVar9;
  curltime *when;
  long lVar10;
  bool bVar11;
  curltime cVar12;
  int breply_ms;
  undefined8 uStack_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 5) {
      iVar7 = 5;
    }
    else {
      if (query != 4) {
        if (query == 2) {
          pvVar1 = cf->ctx;
          uVar9 = 0xffffffff;
          lVar10 = 0;
          uStack_38 = in_RAX;
          do {
            lVar2 = *(long *)((long)pvVar1 + lVar10 * 8 + 0x20);
            if ((lVar2 != 0) && (plVar3 = *(long **)(lVar2 + 0x28), plVar3 != (long *)0x0)) {
              iVar7 = (**(code **)(*plVar3 + 0x70))(plVar3,data,2,(long)&uStack_38 + 4,0);
              if (-1 < uStack_38 && iVar7 == 0) {
                uVar6 = uVar9;
                if ((int)uStack_38._4_4_ < (int)uVar9) {
                  uVar6 = uStack_38._4_4_;
                }
                bVar11 = (int)uVar9 < 0;
                uVar9 = uVar6;
                if (bVar11) {
                  uVar9 = uStack_38._4_4_;
                }
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 == 1);
          *pres1 = uVar9;
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar4 = (data->state).feat;
          if (pcVar4 == (curl_trc_feat *)0x0) {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_OK;
            }
          }
          else {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_OK;
            }
            if (pcVar4->log_level < 1) {
              return CURLE_OK;
            }
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          Curl_trc_cf_infof(data,cf,"query connect reply: %dms",(ulong)uVar9);
          return CURLE_OK;
        }
        goto LAB_0011c6cc;
      }
      iVar7 = 4;
    }
    cVar12 = get_max_baller_time(cf,data,iVar7);
    *(time_t *)pres2 = cVar12.tv_sec;
    *(int *)((long)pres2 + 8) = cVar12.tv_usec;
    CVar8 = CURLE_OK;
  }
  else {
LAB_0011c6cc:
    pCVar5 = cf->next;
    if (pCVar5 != (Curl_cfilter *)0x0) {
      CVar8 = (*pCVar5->cft->query)(pCVar5,data,query,pres1,pres2);
      return CVar8;
    }
    CVar8 = CURLE_UNKNOWN_OPTION;
  }
  return CVar8;
}

Assistant:

static CURLcode cf_he_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_he_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_CONNECT_REPLY_MS: {
      int reply_ms = -1;
      size_t i;

      for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
        struct eyeballer *baller = ctx->baller[i];
        int breply_ms;

        if(baller && baller->cf &&
           !baller->cf->cft->query(baller->cf, data, query,
                                   &breply_ms, NULL)) {
          if(breply_ms >= 0 && (reply_ms < 0 || breply_ms < reply_ms))
            reply_ms = breply_ms;
        }
      }
      *pres1 = reply_ms;
      CURL_TRC_CF(data, cf, "query connect reply: %dms", *pres1);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }

  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}